

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallExportGenerator::TempDirCalculate_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  string *str;
  ulong uVar1;
  string local_b8;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  undefined1 local_19;
  cmInstallExportGenerator *local_18;
  cmInstallExportGenerator *this_local;
  string *path;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmInstallExportGenerator *)__return_storage_ptr__;
  str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmAlphaNum::cmAlphaNum(&local_50,str);
  cmAlphaNum::cmAlphaNum(&local_80,"/CMakeFiles/Export");
  cmStrCat<>(__return_storage_ptr__,&local_50,&local_80);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
    cmSystemTools::ComputeStringMD5(&local_b8,&(this->super_cmInstallGenerator).Destination);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::TempDirCalculate() const
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  std::string path = cmStrCat(
    this->LocalGenerator->GetCurrentBinaryDirectory(), "/CMakeFiles/Export");
  if (this->Destination.empty()) {
    return path;
  }

#ifndef CMAKE_BOOTSTRAP
  path += '/';
  // Replace the destination path with a hash to keep it short.
  path += cmSystemTools::ComputeStringMD5(this->Destination);
#endif

  return path;
}